

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O2

bool __thiscall
dg::vr::VectorSet<llvm::Value_const*>::erase<llvm::Value_const*,bool>
          (VectorSet<llvm::Value_const*> *this,Value **val)

{
  Value **ppVVar1;
  iterator __position;
  
  __position = find<llvm::Value_const*>(this,val);
  ppVVar1 = *(Value ***)(this + 8);
  if (__position._M_current != ppVVar1) {
    std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::erase
              ((vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *)this,
               (const_iterator)__position._M_current);
  }
  return __position._M_current != ppVVar1;
}

Assistant:

bool erase(const S &val) {
        auto it = find(val);
        if (it == vec.end())
            return false;
        vec.erase(it);
        return true;
    }